

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  pixel_type *ppVar5;
  pixel_type *ppVar6;
  int32_t iVar7;
  triplet<unsigned_short> tVar8;
  int iVar9;
  triplet<unsigned_short> rb;
  uint uVar10;
  
  ppVar5 = this->current_line_;
  uVar1 = ppVar5[(long)start_index + -1].field_0;
  uVar3 = ppVar5[(long)start_index + -1].field_1;
  tVar8.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)uVar3;
  tVar8.field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)uVar1;
  tVar8.field_2.v3 = ppVar5[(long)start_index + -1].field_2.v3;
  iVar7 = decode_run_pixels(this,tVar8,ppVar5 + start_index,this->width_ - start_index);
  uVar10 = start_index + iVar7;
  if (uVar10 != this->width_) {
    ppVar5 = this->previous_line_ + uVar10;
    uVar2 = ppVar5->field_0;
    uVar4 = ppVar5->field_1;
    rb.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)uVar4;
    rb.field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)uVar2;
    rb.field_2.v3 = this->previous_line_[uVar10].field_2.v3;
    tVar8 = decode_run_interruption_pixel(this,tVar8,rb);
    ppVar6 = this->current_line_;
    ppVar5 = ppVar6 + uVar10;
    ppVar5->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)tVar8._0_4_;
    ppVar5->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)((uint)tVar8._0_4_ >> 0x10);
    ppVar6[uVar10].field_2.v3 = (unsigned_short)tVar8.field_2;
    iVar9 = 1;
    if (1 < this->run_index_) {
      iVar9 = this->run_index_;
    }
    this->run_index_ = iVar9 + -1;
    iVar7 = iVar7 + 1;
  }
  return iVar7;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }